

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QCborMap *m)

{
  bool bVar1;
  QDebug *t;
  QCborContainerPrivate *v;
  QDebug *pQVar2;
  QDebugStateSaver *this;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar3;
  QCborValueConstRef QVar4;
  QCborMap *__range1;
  char *open;
  value_type pair;
  const_iterator __end1;
  const_iterator __begin1;
  QDebugStateSaver saver;
  undefined7 in_stack_fffffffffffffeb8;
  char in_stack_fffffffffffffebf;
  QCborValue *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  QDebugStateSaver *in_stack_fffffffffffffee0;
  QDebug *in_stack_fffffffffffffee8;
  Stream *this_00;
  QDebug local_a8 [2];
  QDebug local_98 [2];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QCborValueConstRef local_68;
  ConstIterator local_58;
  undefined1 *local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver
            (in_stack_fffffffffffffee0,
             (QDebug *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  t = QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_fffffffffffffee8,(char *)t);
  local_58.item.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.item.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  cVar3 = QCborMap::begin((QCborMap *)0x47752a);
  local_58.item.i = cVar3.item.i;
  v = cVar3.item.d;
  local_68.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.item.d = v;
  QVar4 = (QCborValueConstRef)QCborMap::end((QCborMap *)0x477569);
  local_68 = QVar4;
  while( true ) {
    bVar1 = operator!=((ConstIterator *)in_stack_fffffffffffffec0,
                       (ConstIterator *)
                       CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    if (!bVar1) break;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QCborMap::ConstIterator::operator*((ConstIterator *)CONCAT17(bVar1,in_stack_fffffffffffffed8));
    pQVar2 = QDebug::operator<<((QDebug *)QVar4.d,(char *)t);
    QDebug::QDebug(local_a8,pQVar2);
    QCborValueConstRef::operator_cast_to_QCborValue
              ((QCborValueConstRef *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    operator<<((QDebug *)in_RDI,(QCborValue *)v);
    pQVar2 = QDebug::operator<<((QDebug *)QVar4.d,(char *)t);
    QDebug::QDebug(local_98,pQVar2);
    QCborValueConstRef::operator_cast_to_QCborValue
              ((QCborValueConstRef *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    operator<<((QDebug *)in_RDI,(QCborValue *)v);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebf);
    QDebug::~QDebug((QDebug *)this_00);
    QCborValue::~QCborValue(in_stack_fffffffffffffec0);
    QDebug::~QDebug((QDebug *)this_00);
    QDebug::~QDebug((QDebug *)this_00);
    QCborValue::~QCborValue(in_stack_fffffffffffffec0);
    QDebug::~QDebug((QDebug *)this_00);
    QCborMap::ConstIterator::operator++(&local_58);
  }
  this = (QDebugStateSaver *)
         QDebug::operator<<((QDebug *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebf);
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)this);
  QDebugStateSaver::~QDebugStateSaver(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborMap &m)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborMap{";
    const char *open = "{";
    for (auto pair : m) {
        dbg << open << pair.first <<  ", " << pair.second << '}';
        open = ", {";
    }
    return dbg << '}';
}